

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall
FloatInterval_DifferenceOfProducts_Test::TestBody(FloatInterval_DifferenceOfProducts_Test *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  RNG *in_RSI;
  char *pcVar13;
  uint64_t uVar14;
  undefined1 *puVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Interval IVar24;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM5 [16];
  Interval b;
  AssertionResult gtest_ar;
  double pr;
  Interval c;
  RNG rng;
  Message local_d0;
  Interval local_c8;
  internal local_c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  AssertHelper local_b0;
  double local_a8;
  Interval local_a0;
  RNG local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  uVar14 = 1;
  uVar11 = 0;
  lVar12 = 0;
  puVar15 = &DAT_5851f42d4c957f2e;
  do {
    uVar9 = (uVar11 >> 0x1b ^ uVar11) * -0x7e25210b43d22bb3;
    local_98.state = (uint64_t)(puVar15 + (uVar9 >> 0x21 ^ uVar9) * 0x5851f42d4c957f2d);
    auVar16._0_4_ = in_ZMM1._0_4_;
    local_98.inc = uVar14;
    auVar25._0_8_ = getFloat(&local_98,in_ZMM0._0_4_,auVar16._0_4_);
    auVar25._8_56_ = extraout_var;
    local_78 = auVar25._0_16_;
    if (auVar25._0_4_ < 0.0) {
      auVar18 = vmovshdup_avx(local_78);
      fVar38 = auVar18._0_4_;
      if (fVar38 <= 0.0) {
        uVar2 = vcmpss_avx512f(auVar18,local_78,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar31._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar18._8_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar18._12_4_ ^ 0x80000000;
        fVar34 = -auVar25._0_4_;
        auVar17._4_12_ = auVar31._4_12_;
        auVar17._0_4_ = (uint)bVar7 * (int)fVar34 + (uint)!bVar7 * (int)-fVar38;
        uVar2 = vcmpss_avx512f(local_78,auVar18,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar16._0_4_ = (Float)((uint)bVar7 * (int)fVar34 + (uint)!bVar7 * (int)-fVar38);
        auVar16._4_12_ = auVar17._4_12_;
        local_78 = vinsertps_avx(auVar17,auVar16,0x10);
      }
      else {
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar16 = vxorps_avx512vl(local_78,auVar3);
        auVar18 = vmaxss_avx(auVar18,auVar16);
        auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
        local_78 = vinsertps_avx(auVar18,auVar18,0x1d);
      }
    }
    auVar26._0_8_ = getFloat(&local_98,local_78._0_4_,auVar16._0_4_);
    auVar26._8_56_ = extraout_var_00;
    auVar18 = auVar26._0_16_;
    if (auVar26._0_4_ < 0.0) {
      auVar16 = vmovshdup_avx(auVar18);
      if (auVar16._0_4_ <= 0.0) {
        uVar2 = vcmpss_avx512f(auVar16,auVar18,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar35._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        auVar35._8_4_ = auVar16._8_4_ ^ 0x80000000;
        auVar35._12_4_ = auVar16._12_4_ ^ 0x80000000;
        fVar38 = -auVar26._0_4_;
        auVar19._4_12_ = auVar35._4_12_;
        auVar19._0_4_ = (uint)bVar7 * (int)fVar38 + (uint)!bVar7 * (int)-auVar16._0_4_;
        uVar2 = vcmpss_avx512f(auVar18,auVar16,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar18._0_4_ = (uint)bVar7 * (int)fVar38 + (uint)!bVar7 * (int)-auVar16._0_4_;
        auVar18._4_12_ = auVar19._4_12_;
        auVar18 = vinsertps_avx(auVar19,auVar18,0x10);
      }
      else {
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar18 = vxorps_avx512vl(auVar18,auVar4);
        auVar18 = vmaxss_avx(auVar16,auVar18);
        auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
        auVar18 = vinsertps_avx(auVar18,auVar18,0x1d);
      }
    }
    local_c8 = (Interval)vmovlps_avx(auVar18);
    auVar27._0_8_ = getFloat(&local_98,auVar18._0_4_,auVar16._0_4_);
    auVar27._8_56_ = extraout_var_01;
    auVar18 = auVar27._0_16_;
    if (auVar27._0_4_ < 0.0) {
      auVar16 = vmovshdup_avx(auVar18);
      if (auVar16._0_4_ <= 0.0) {
        uVar2 = vcmpss_avx512f(auVar16,auVar18,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar36._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        auVar36._8_4_ = auVar16._8_4_ ^ 0x80000000;
        auVar36._12_4_ = auVar16._12_4_ ^ 0x80000000;
        fVar38 = -auVar27._0_4_;
        auVar20._4_12_ = auVar36._4_12_;
        auVar20._0_4_ = (uint)bVar7 * (int)fVar38 + (uint)!bVar7 * (int)-auVar16._0_4_;
        uVar2 = vcmpss_avx512f(auVar18,auVar16,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar21._0_4_ = (uint)bVar7 * (int)fVar38 + (uint)!bVar7 * (int)-auVar16._0_4_;
        auVar21._4_12_ = auVar20._4_12_;
        auVar18 = vinsertps_avx(auVar20,auVar21,0x10);
      }
      else {
        auVar5._8_4_ = 0x80000000;
        auVar5._0_8_ = 0x8000000080000000;
        auVar5._12_4_ = 0x80000000;
        auVar18 = vxorps_avx512vl(auVar18,auVar5);
        auVar18 = vmaxss_avx(auVar16,auVar18);
        auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
        auVar18 = vinsertps_avx(auVar18,auVar18,0x1d);
      }
    }
    local_a0 = (Interval)vmovlps_avx(auVar18);
    auVar28._0_8_ = getFloat(&local_98,auVar18._0_4_,auVar16._0_4_);
    auVar28._8_56_ = extraout_var_02;
    local_48 = auVar28._0_16_;
    if (auVar28._0_4_ < 0.0) {
      auVar16 = vmovshdup_avx(local_48);
      fVar38 = auVar16._0_4_;
      if (fVar38 <= 0.0) {
        uVar2 = vcmpss_avx512f(auVar16,local_48,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar32._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = auVar16._8_4_ ^ 0x80000000;
        auVar32._12_4_ = auVar16._12_4_ ^ 0x80000000;
        fVar34 = -auVar28._0_4_;
        auVar22._4_12_ = auVar32._4_12_;
        auVar22._0_4_ = (uint)bVar7 * (int)fVar34 + (uint)!bVar7 * (int)-fVar38;
        uVar2 = vcmpss_avx512f(local_48,auVar16,1);
        bVar7 = (bool)((byte)uVar2 & 1);
        auVar23._0_4_ = (uint)bVar7 * (int)fVar34 + (uint)!bVar7 * (int)-fVar38;
        auVar23._4_12_ = auVar22._4_12_;
        local_48 = vinsertps_avx(auVar22,auVar23,0x10);
      }
      else {
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        auVar18 = vxorps_avx512vl(local_48,auVar6);
        auVar16 = vmaxss_avx(auVar16,auVar18);
        auVar16 = vmaxss_avx(auVar16,ZEXT816(0) << 0x40);
        local_48 = vinsertps_avx(auVar16,auVar16,0x1d);
      }
    }
    uVar8 = (uint)(local_98.state >> 0x2d) ^ (uint)(local_98.state >> 0x1b);
    bVar10 = (byte)(local_98.state >> 0x3b);
    auVar16 = vcvtusi2ss_avx512f(in_XMM5,uVar8 >> bVar10 | uVar8 << 0x20 - bVar10);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    uVar2 = vcmpss_avx512f(auVar16,ZEXT416(0xbf000000),1);
    bVar7 = (bool)((byte)uVar2 & 1);
    auVar16._0_4_ = (Float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * 0x3f800000);
    IVar24.high = auVar16._0_4_;
    IVar24.low = auVar16._0_4_;
    local_88._8_4_ = auVar16._0_4_;
    local_88._0_4_ = auVar16._0_4_;
    local_88._4_4_ = auVar16._0_4_;
    local_88._12_4_ = auVar16._0_4_;
    local_98.state = local_98.state * 0x5851f42d4c957f2d + local_98.inc;
    auVar29._0_8_ = pbrt::Interval::operator*(&local_c8,IVar24);
    auVar29._8_56_ = extraout_var_03;
    local_c8 = (Interval)vmovlps_avx(auVar29._0_16_);
    auVar30._0_8_ = pbrt::Interval::operator*(&local_a0,(Interval)local_88._0_8_);
    auVar30._8_56_ = extraout_var_04;
    local_88 = auVar30._0_16_;
    local_a0 = (Interval)vmovlps_avx(local_88);
    vmovshdup_avx(local_78);
    local_50 = getPrecise((Interval *)&local_98,in_RSI);
    local_58 = getPrecise((Interval *)&local_98,in_RSI);
    vmovshdup_avx(local_88);
    local_60 = getPrecise((Interval *)&local_98,in_RSI);
    vmovshdup_avx(local_48);
    local_68 = getPrecise((Interval *)&local_98,in_RSI);
    IVar24 = pbrt::DifferenceOfProducts
                       ((Interval)local_78._0_8_,local_c8,(Interval)local_88._0_8_,
                        (Interval)local_48._0_8_);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_60;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_68;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_58;
    local_78._8_8_ = extraout_XMM0_Qb;
    local_78._0_4_ = IVar24.low;
    local_78._4_4_ = IVar24.high;
    local_d0.ss_.ptr_._0_4_ = IVar24.low;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_50;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_60 * local_68;
    auVar16 = vfmsub132sd_fma(auVar37,auVar33,auVar1);
    auVar18 = vfnmadd213sd_fma(auVar40,auVar39,auVar33);
    local_a8 = auVar16._0_8_ + auVar18._0_8_;
    in_ZMM1 = ZEXT864((ulong)local_a8);
    testing::internal::CmpHelperGE<double,float>
              (local_c0,"pr","r.LowerBound()",&local_a8,(float *)&local_d0);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message(&local_d0);
      std::ostream::operator<<
                ((ostream *)(CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) + 0x10),
                 (int)lVar12);
      in_ZMM1._8_56_ = extraout_var_07;
      in_ZMM1._0_8_ = extraout_XMM1_Qa;
      pcVar13 = "";
      if (local_b8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = ((local_b8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                 ,0x32a,pcVar13);
      testing::internal::AssertHelper::operator=(&local_b0,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) != 0) {
        bVar7 = testing::internal::IsTrue(true);
        if ((bVar7) &&
           ((long *)CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) + 8))();
          in_ZMM1._8_56_ = extraout_var_08;
          in_ZMM1._0_8_ = extraout_XMM1_Qa_00;
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    in_ZMM0 = ZEXT1664(local_78);
    local_d0.ss_.ptr_._0_4_ = (Float)vextractps_avx(local_78,1);
    testing::internal::CmpHelperLE<double,float>
              (local_c0,"pr","r.UpperBound()",&local_a8,(float *)&local_d0);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message(&local_d0);
      auVar16 = std::ostream::operator<<
                          ((ostream *)
                           (CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) + 0x10),
                           (int)lVar12);
      in_ZMM1._0_8_ = auVar16._8_8_;
      in_ZMM0._0_8_ = auVar16._0_8_;
      in_ZMM1._8_56_ = extraout_var_09;
      in_ZMM0._8_56_ = extraout_var_05;
      pcVar13 = "";
      if (local_b8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = ((local_b8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                 ,0x32b,pcVar13);
      testing::internal::AssertHelper::operator=(&local_b0,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) != 0) {
        bVar7 = testing::internal::IsTrue(true);
        if ((bVar7) &&
           ((long *)CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) != (long *)0x0)) {
          auVar16 = (**(code **)(*(long *)CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_)
                                + 8))();
          in_ZMM1._0_8_ = auVar16._8_8_;
          in_ZMM0._0_8_ = auVar16._0_8_;
          in_ZMM1._8_56_ = extraout_var_10;
          in_ZMM0._8_56_ = extraout_var_06;
        }
      }
    }
    in_RSI = (RNG *)0x0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar12 = lVar12 + 1;
    uVar14 = uVar14 + 2;
    puVar15 = puVar15 + -0x4f5c17a566d501a4;
    uVar11 = uVar11 + 0x7fb5d329728ea185;
  } while (lVar12 != 1000000);
  return;
}

Assistant:

TEST(FloatInterval, DifferenceOfProducts) {
    for (int trial = 0; trial < kFloatIntervalIters; ++trial) {
        RNG rng(trial);

        Interval a = Abs(getFloat(rng));
        Interval b = Abs(getFloat(rng));
        Interval c = Abs(getFloat(rng));
        Interval d = Abs(getFloat(rng));

        Float sign = rng.Uniform<Float>() < -0.5 ? -1 : 1;
        b *= sign;
        c *= sign;

        double pa = getPrecise(a, rng);
        double pb = getPrecise(b, rng);
        double pc = getPrecise(c, rng);
        double pd = getPrecise(d, rng);

        Interval r = DifferenceOfProducts(a, b, c, d);
        double pr = DifferenceOfProducts(pa, pb, pc, pd);

        EXPECT_GE(pr, r.LowerBound()) << trial;
        EXPECT_LE(pr, r.UpperBound()) << trial;
    }
}